

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slist_wc.c
# Opt level: O3

slist_wc * slist_wc_append(slist_wc *list,char *data)

{
  curl_slist *pcVar1;
  slist_wc *psVar2;
  
  pcVar1 = (curl_slist *)curl_slist_append(0);
  psVar2 = (slist_wc *)0x0;
  if (pcVar1 != (curl_slist *)0x0) {
    if (list == (slist_wc *)0x0) {
      psVar2 = (slist_wc *)malloc(0x10);
      if (psVar2 == (slist_wc *)0x0) {
        curl_slist_free_all(pcVar1);
        psVar2 = (slist_wc *)0x0;
      }
      else {
        psVar2->first = pcVar1;
        psVar2->last = pcVar1;
      }
    }
    else {
      list->last->next = pcVar1;
      list->last = pcVar1;
      psVar2 = list;
    }
  }
  return psVar2;
}

Assistant:

struct slist_wc *slist_wc_append(struct slist_wc *list,
                                 const char *data)
{
  struct curl_slist *new_item = curl_slist_append(NULL, data);

  if(!new_item)
    return NULL;

  if(!list) {
    list = malloc(sizeof(struct slist_wc));

    if(!list) {
      curl_slist_free_all(new_item);
      return NULL;
    }

    list->first = new_item;
    list->last = new_item;
    return list;
  }

  list->last->next = new_item;
  list->last = list->last->next;
  return list;
}